

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::
_preBegin__profile_GLES__technique__pass__states__point_size_min
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  ParserTemplateBase *this_00;
  StringHash attributeHash;
  long *in_RSI;
  ParserChar *in_RDI;
  float fVar2;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  profile_GLES__technique__pass__states__point_size_min__AttributeData *attributeData;
  ParserChar *in_stack_00000088;
  ParserChar *in_stack_00000090;
  StringHash in_stack_00000098;
  ErrorType in_stack_000000a0;
  Severity in_stack_000000a4;
  ParserTemplateBase *in_stack_000000a8;
  undefined7 in_stack_ffffffffffffffa8;
  byte in_stack_ffffffffffffffaf;
  ParserTemplateBase *in_stack_ffffffffffffffb0;
  SaxParser *additionalText;
  ParserChar *text;
  undefined8 *puVar3;
  bool local_1;
  
  this_00 = (ParserTemplateBase *)
            GeneratedSaxParser::ParserTemplateBase::
            newData<COLLADASaxFWL15::profile_GLES__technique__pass__states__point_size_min__AttributeData>
                      (in_stack_ffffffffffffffb0,
                       (void **)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  puVar3 = (undefined8 *)*in_RSI;
  if (puVar3 == (undefined8 *)0x0) {
LAB_009f5aa6:
    local_1 = true;
  }
  else {
    do {
      while( true ) {
        while( true ) {
          text = (ParserChar *)*puVar3;
          if (text == (ParserChar *)0x0) goto LAB_009f5aa6;
          attributeHash = GeneratedSaxParser::Utils::calculateStringHash(text);
          if (puVar3 + 1 == (undefined8 *)0x0) {
            return false;
          }
          additionalText = (SaxParser *)puVar3[1];
          puVar3 = puVar3 + 2;
          if (attributeHash != 0x76887d) break;
          (this_00->super_Parser).mSaxParser = additionalText;
        }
        if (attributeHash != 0x7c83b5) break;
        fVar2 = GeneratedSaxParser::Utils::toFloat(in_RDI,(bool *)0x7c83b5);
        *(float *)&(this_00->super_Parser)._vptr_Parser = fVar2;
        if (((in_stack_ffffffffffffffaf & 1) != 0) &&
           (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              (this_00,(Severity)((ulong)puVar3 >> 0x20),(ErrorType)puVar3,
                               (StringHash)text,attributeHash,(ParserChar *)additionalText), bVar1))
        {
          return false;
        }
      }
      bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_00000098,
                         in_stack_00000090,in_stack_00000088);
    } while (!bVar1);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__profile_GLES__technique__pass__states__point_size_min( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_GLES__technique__pass__states__point_size_min( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_GLES__technique__pass__states__point_size_min__AttributeData* attributeData = newData<profile_GLES__technique__pass__states__point_size_min__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_VALUE:
    {
bool failed;
attributeData->value = GeneratedSaxParser::Utils::toFloat(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_POINT_SIZE_MIN,
        HASH_ATTRIBUTE_VALUE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_PARAM:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_POINT_SIZE_MIN,
            HASH_ATTRIBUTE_PARAM,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_POINT_SIZE_MIN, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}